

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O1

int scope_define(scope sp,char *key,value val)

{
  int iVar1;
  
  if (val != (value)0x0 && (key != (char *)0x0 && sp != (scope)0x0)) {
    iVar1 = set_contains(sp->objects,key);
    if (iVar1 != 0) {
      iVar1 = set_insert(sp->objects,key,val);
      return iVar1;
    }
    log_write_impl_va("metacall",0xb9,"scope_define",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                      ,LOG_LEVEL_ERROR,
                      "Scope failed to define a object with key \'%s\', this key as already been defined"
                      ,key);
  }
  return 1;
}

Assistant:

int scope_define(scope sp, const char *key, value val)
{
	if (sp != NULL && key != NULL && val != NULL)
	{
		if (set_contains(sp->objects, (set_key)key) == 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Scope failed to define a object with key '%s', this key as already been defined", (char *)key);

			return 1;
		}

		return set_insert(sp->objects, (set_key)key, (set_value)val);
	}

	return 1;
}